

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

cf_bool_t cf_sock_close(cf_sock_t sock)

{
  int iVar1;
  undefined4 local_c;
  cf_sock_t sock_local;
  
  if (sock == -1) {
    local_c = 1;
  }
  else {
    iVar1 = close(sock);
    local_c = (uint)(iVar1 == 0);
  }
  return local_c;
}

Assistant:

cf_bool_t cf_sock_close(cf_sock_t sock) {
    if (sock != CF_SOCK_INVALID) {
#ifdef CF_OS_WIN
        return closesocket(sock) == 0;
#else
        return close(sock) == 0;
#endif
    }
    return CF_TRUE;
}